

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O1

void convert<unsigned_short,signed_char>(vector<unsigned_char,_std::allocator<unsigned_char>_> *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ushort uVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  uint uVar7;
  ulong uVar8;
  vector<signed_char,_std::allocator<signed_char>_> dst;
  key_type local_70;
  size_type local_68;
  key_type local_60;
  key_type local_58;
  key_type local_50;
  vector<signed_char,_std::allocator<signed_char>_> local_48;
  
  uVar7 = (uint)((ulong)((long)(src->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(src->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 1);
  sVar6 = (size_type)(int)uVar7;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (&local_48,sVar6,(allocator_type *)&local_70);
  local_68 = sVar6;
  if (0 < (int)uVar7) {
    uVar8 = 0;
    do {
      uVar4 = *(ushort *)
               ((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar8 * 2);
      local_70._M_target = (type_info *)&unsigned_short::typeinfo;
      pmVar5 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleOffset,&local_70);
      fVar1 = *pmVar5;
      local_50._M_target = (type_info *)&unsigned_short::typeinfo;
      pmVar5 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleScale,&local_50);
      fVar2 = *pmVar5;
      local_58._M_target = (type_info *)&signed_char::typeinfo;
      pmVar5 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleScale,&local_58);
      fVar3 = *pmVar5;
      local_60._M_target = (type_info *)&signed_char::typeinfo;
      pmVar5 = std::
               map<std::type_index,_float,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_float>_>_>
               ::at(&kSampleOffset,&local_60);
      local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] =
           (char)(int)((((float)uVar4 - fVar1) / fVar2) * fVar3 + *pmVar5);
      uVar8 = uVar8 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar8);
  }
  sVar6 = local_68;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(src,local_68);
  memcpy((src->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start,
         local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
         super__Vector_impl_data._M_start,sVar6);
  if (local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void convert(std::vector<uint8_t> & src) {
    const int n = src.size()/sizeof(S);
    std::vector<D> dst(n);
    S v;
    for (int i = 0; i < n; ++i) {
        std::memcpy(&v, &src[i*sizeof(S)], sizeof(S));
        dst[i] = ((float(v) - kSampleOffset.at(typeid(S)))/kSampleScale.at(typeid(S)))*kSampleScale.at(typeid(D)) + kSampleOffset.at(typeid(D));
    }

    src.resize(n*sizeof(D));
    std::memcpy(&src[0], &dst[0], n*sizeof(D));
}